

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char-test.c++
# Opt level: O0

void __thiscall kj::parse::anon_unknown_0::TestCase135::run(TestCase135 *this)

{
  char **ppcVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  bool local_224;
  bool local_223;
  undefined1 local_222 [6];
  bool _kj_shouldLog_11;
  bool _kj_shouldLog_10;
  Maybe<char> result_5;
  Input input_5;
  StringPtr text_5;
  undefined1 local_1e8 [4];
  bool _kj_shouldLog_9;
  bool _kj_shouldLog_8;
  Maybe<char> result_4;
  Input input_4;
  StringPtr text_4;
  undefined1 local_1b0 [4];
  bool _kj_shouldLog_7;
  bool _kj_shouldLog_6;
  Maybe<char> result_3;
  Input input_3;
  StringPtr text_3;
  undefined1 local_178 [7];
  bool _kj_shouldLog_5;
  char local_15a;
  bool local_159;
  char *pcStack_158;
  bool _kj_shouldLog_4;
  char *value_2;
  undefined1 local_148 [6];
  Maybe<char> result_2;
  Input input_2;
  StringPtr text_2;
  undefined1 local_110 [7];
  bool _kj_shouldLog_3;
  char local_f2;
  bool local_f1;
  char *pcStack_f0;
  bool _kj_shouldLog_2;
  char *value_1;
  undefined1 local_e0 [6];
  Maybe<char> result_1;
  Input input_1;
  StringPtr text_1;
  undefined1 local_a8 [7];
  bool _kj_shouldLog_1;
  char local_8a;
  bool local_89;
  char *pcStack_88;
  bool _kj_shouldLog;
  char *value;
  undefined1 local_6a [8];
  Maybe<char> result;
  Input input;
  StringPtr text;
  CharGroup_ parser;
  TestCase135 *this_local;
  
  text.content.size_ = 0x4000000000000;
  ppcVar1 = &input.best;
  StringPtr::StringPtr((StringPtr *)ppcVar1,"a");
  pcVar3 = StringPtr::begin((StringPtr *)ppcVar1);
  pcVar4 = StringPtr::end((StringPtr *)ppcVar1);
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)(local_6a + 2),pcVar3,pcVar4);
  CharGroup_::operator()
            ((CharGroup_ *)local_6a,(IteratorInput<char,_const_char_*> *)&text.content.size_);
  pcStack_88 = kj::_::readMaybe<char>((Maybe<char> *)local_6a);
  if (pcStack_88 == (char *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x91);
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)local_a8,(char (*) [33])"Expected parse result, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_a8);
  }
  else if (*pcStack_88 != 'a') {
    local_89 = kj::_::Debug::shouldLog(ERROR);
    while (local_89 != false) {
      local_8a = 'a';
      kj::_::Debug::log<char_const(&)[35],char,char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x8f,ERROR,"\"failed: expected \" \"(\'a\') == (*value)\", \'a\', *value",
                 (char (*) [35])"failed: expected (\'a\') == (*value)",&local_8a,pcStack_88);
      local_89 = false;
    }
  }
  bVar2 = IteratorInput<char,_const_char_*>::atEnd
                    ((IteratorInput<char,_const_char_*> *)(local_6a + 2));
  if (!bVar2) {
    text_1.content.size_._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (text_1.content.size_._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x93,ERROR,"\"failed: expected \" \"input.atEnd()\"",
                 (char (*) [31])"failed: expected input.atEnd()");
      text_1.content.size_._7_1_ = false;
    }
  }
  Maybe<char>::~Maybe((Maybe<char> *)local_6a);
  IteratorInput<char,_const_char_*>::~IteratorInput
            ((IteratorInput<char,_const_char_*> *)(local_6a + 2));
  ppcVar1 = &input_1.best;
  StringPtr::StringPtr((StringPtr *)ppcVar1,"n");
  pcVar3 = StringPtr::begin((StringPtr *)ppcVar1);
  pcVar4 = StringPtr::end((StringPtr *)ppcVar1);
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)local_e0,pcVar3,pcVar4);
  CharGroup_::operator()
            ((CharGroup_ *)((long)&value_1 + 6),
             (IteratorInput<char,_const_char_*> *)&text.content.size_);
  pcStack_f0 = kj::_::readMaybe<char>((Maybe<char> *)((long)&value_1 + 6));
  if (pcStack_f0 == (char *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)local_110,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x9d);
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)local_110,(char (*) [33])"Expected parse result, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_110);
  }
  else if (*pcStack_f0 != 'n') {
    local_f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_f1 != false) {
      local_f2 = 'n';
      kj::_::Debug::log<char_const(&)[35],char,char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x9b,ERROR,"\"failed: expected \" \"(\'n\') == (*value)\", \'n\', *value",
                 (char (*) [35])"failed: expected (\'n\') == (*value)",&local_f2,pcStack_f0);
      local_f1 = false;
    }
  }
  bVar2 = IteratorInput<char,_const_char_*>::atEnd((IteratorInput<char,_const_char_*> *)local_e0);
  if (!bVar2) {
    text_2.content.size_._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (text_2.content.size_._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x9f,ERROR,"\"failed: expected \" \"input.atEnd()\"",
                 (char (*) [31])"failed: expected input.atEnd()");
      text_2.content.size_._7_1_ = false;
    }
  }
  Maybe<char>::~Maybe((Maybe<char> *)((long)&value_1 + 6));
  IteratorInput<char,_const_char_*>::~IteratorInput((IteratorInput<char,_const_char_*> *)local_e0);
  ppcVar1 = &input_2.best;
  StringPtr::StringPtr((StringPtr *)ppcVar1,"B");
  pcVar3 = StringPtr::begin((StringPtr *)ppcVar1);
  pcVar4 = StringPtr::end((StringPtr *)ppcVar1);
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)local_148,pcVar3,pcVar4);
  CharGroup_::operator()
            ((CharGroup_ *)((long)&value_2 + 6),
             (IteratorInput<char,_const_char_*> *)&text.content.size_);
  pcStack_158 = kj::_::readMaybe<char>((Maybe<char> *)((long)&value_2 + 6));
  if (pcStack_158 == (char *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)local_178,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0xa9);
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)local_178,(char (*) [33])"Expected parse result, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_178);
  }
  else if (*pcStack_158 != 'B') {
    local_159 = kj::_::Debug::shouldLog(ERROR);
    while (local_159 != false) {
      local_15a = 'B';
      kj::_::Debug::log<char_const(&)[35],char,char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0xa7,ERROR,"\"failed: expected \" \"(\'B\') == (*value)\", \'B\', *value",
                 (char (*) [35])"failed: expected (\'B\') == (*value)",&local_15a,pcStack_158);
      local_159 = false;
    }
  }
  bVar2 = IteratorInput<char,_const_char_*>::atEnd((IteratorInput<char,_const_char_*> *)local_148);
  if (!bVar2) {
    text_3.content.size_._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (text_3.content.size_._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0xab,ERROR,"\"failed: expected \" \"input.atEnd()\"",
                 (char (*) [31])"failed: expected input.atEnd()");
      text_3.content.size_._7_1_ = false;
    }
  }
  Maybe<char>::~Maybe((Maybe<char> *)((long)&value_2 + 6));
  IteratorInput<char,_const_char_*>::~IteratorInput((IteratorInput<char,_const_char_*> *)local_148);
  ppcVar1 = &input_3.best;
  StringPtr::StringPtr((StringPtr *)ppcVar1,"b");
  pcVar3 = StringPtr::begin((StringPtr *)ppcVar1);
  pcVar4 = StringPtr::end((StringPtr *)ppcVar1);
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)local_1b0,pcVar3,pcVar4);
  CharGroup_::operator()
            ((CharGroup_ *)((long)&text_4.content.size_ + 6),
             (IteratorInput<char,_const_char_*> *)&text.content.size_);
  bVar2 = Maybe<char>::operator==((Maybe<char> *)((long)&text_4.content.size_ + 6),(void *)0x0);
  if (!bVar2) {
    text_4.content.size_._5_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)text_4.content.size_._5_1_ != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0xb2,ERROR,"\"failed: expected \" \"result == nullptr\"",
                 (char (*) [35])"failed: expected result == nullptr");
      text_4.content.size_._5_1_ = false;
    }
  }
  bVar2 = IteratorInput<char,_const_char_*>::atEnd((IteratorInput<char,_const_char_*> *)local_1b0);
  if (bVar2) {
    text_4.content.size_._4_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)text_4.content.size_._4_1_ != false) {
      kj::_::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0xb3,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
                 (char (*) [34])"failed: expected !(input.atEnd())");
      text_4.content.size_._4_1_ = false;
    }
  }
  Maybe<char>::~Maybe((Maybe<char> *)((long)&text_4.content.size_ + 6));
  IteratorInput<char,_const_char_*>::~IteratorInput((IteratorInput<char,_const_char_*> *)local_1b0);
  ppcVar1 = &input_4.best;
  StringPtr::StringPtr((StringPtr *)ppcVar1,"j");
  pcVar3 = StringPtr::begin((StringPtr *)ppcVar1);
  pcVar4 = StringPtr::end((StringPtr *)ppcVar1);
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)local_1e8,pcVar3,pcVar4);
  CharGroup_::operator()
            ((CharGroup_ *)((long)&text_5.content.size_ + 6),
             (IteratorInput<char,_const_char_*> *)&text.content.size_);
  bVar2 = Maybe<char>::operator==((Maybe<char> *)((long)&text_5.content.size_ + 6),(void *)0x0);
  if (!bVar2) {
    text_5.content.size_._5_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)text_5.content.size_._5_1_ != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0xba,ERROR,"\"failed: expected \" \"result == nullptr\"",
                 (char (*) [35])"failed: expected result == nullptr");
      text_5.content.size_._5_1_ = false;
    }
  }
  bVar2 = IteratorInput<char,_const_char_*>::atEnd((IteratorInput<char,_const_char_*> *)local_1e8);
  if (bVar2) {
    text_5.content.size_._4_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)text_5.content.size_._4_1_ != false) {
      kj::_::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0xbb,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
                 (char (*) [34])"failed: expected !(input.atEnd())");
      text_5.content.size_._4_1_ = false;
    }
  }
  Maybe<char>::~Maybe((Maybe<char> *)((long)&text_5.content.size_ + 6));
  IteratorInput<char,_const_char_*>::~IteratorInput((IteratorInput<char,_const_char_*> *)local_1e8);
  ppcVar1 = &input_5.best;
  StringPtr::StringPtr((StringPtr *)ppcVar1,"A");
  pcVar3 = StringPtr::begin((StringPtr *)ppcVar1);
  pcVar4 = StringPtr::end((StringPtr *)ppcVar1);
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)(local_222 + 2),pcVar3,pcVar4);
  CharGroup_::operator()
            ((CharGroup_ *)local_222,(IteratorInput<char,_const_char_*> *)&text.content.size_);
  bVar2 = Maybe<char>::operator==((Maybe<char> *)local_222,(void *)0x0);
  if (!bVar2) {
    local_223 = kj::_::Debug::shouldLog(ERROR);
    while (local_223 != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0xc2,ERROR,"\"failed: expected \" \"result == nullptr\"",
                 (char (*) [35])"failed: expected result == nullptr");
      local_223 = false;
    }
  }
  bVar2 = IteratorInput<char,_const_char_*>::atEnd
                    ((IteratorInput<char,_const_char_*> *)(local_222 + 2));
  if (bVar2) {
    local_224 = kj::_::Debug::shouldLog(ERROR);
    while (local_224 != false) {
      kj::_::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0xc3,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
                 (char (*) [34])"failed: expected !(input.atEnd())");
      local_224 = false;
    }
  }
  Maybe<char>::~Maybe((Maybe<char> *)local_222);
  IteratorInput<char,_const_char_*>::~IteratorInput
            ((IteratorInput<char,_const_char_*> *)(local_222 + 2));
  return;
}

Assistant:

TEST(CharParsers, AnyOfChars) {
  constexpr auto parser = anyOfChars("axn2B");

  {
    StringPtr text = "a";
    Input input(text.begin(), text.end());
    Maybe<char> result = parser(input);
    KJ_IF_MAYBE(value, result) {
      EXPECT_EQ('a', *value);
    } else {
      ADD_FAILURE() << "Expected parse result, got null.";
    }
    EXPECT_TRUE(input.atEnd());
  }